

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

int __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::MergeIntoClearedMessages
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *from)

{
  bool bVar1;
  void **ppvVar2;
  int *piVar3;
  LogMessage *pLVar4;
  string_view sVar5;
  LogMessage local_c0;
  Voidify local_a9;
  ClassData *local_a8;
  TypeId local_a0;
  byte local_81;
  LogMessage local_80;
  Voidify local_6d;
  int local_6c;
  int local_68;
  int i;
  void **ppvStack_60;
  int count;
  MessageLite **src;
  MessageLite **dst;
  RepeatedPtrFieldBase *from_local;
  RepeatedPtrFieldBase *this_local;
  ulong local_38;
  size_t line;
  long local_28;
  void *prefetch_ptr;
  ptrdiff_t offset;
  RepeatedPtrFieldBase *local_10;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
    offset = local_38;
    prefetch_ptr = (void *)(local_38 * 0x40 + 0x40);
    local_28 = (long)from + (long)prefetch_ptr;
    local_10 = from;
  }
  dst = (MessageLite **)from;
  from_local = this;
  this_local = from;
  line = (size_t)from;
  ppvVar2 = elements(this);
  src = (MessageLite **)(ppvVar2 + this->current_size_);
  ppvStack_60 = elements((RepeatedPtrFieldBase *)dst);
  local_68 = ClearedCount(this);
  piVar3 = std::min<int>(&local_68,(int *)(dst + 1));
  i = *piVar3;
  local_6c = 0;
  while( true ) {
    if (i <= local_6c) {
      return i;
    }
    local_81 = 0;
    if (ppvStack_60[local_6c] == (void *)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
                 ,0xb4,"src[i] != nullptr");
      local_81 = 1;
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_80);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_6d,pLVar4);
    }
    if ((local_81 & 1) != 0) break;
    local_a0 = TypeId::Get((MessageLite *)ppvStack_60[local_6c]);
    local_a8 = (ClassData *)TypeId::Get((MessageLite *)*ppvStack_60);
    bVar1 = protobuf::operator==(local_a0,(TypeId)local_a8);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.cc"
                 ,0xb5,"TypeId::Get(*src[i]) == TypeId::Get(*src[0])");
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_c0);
      sVar5 = MessageLite::GetTypeName((MessageLite *)ppvStack_60[local_6c]);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,sVar5);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(char (*) [5])" vs ")
      ;
      sVar5 = MessageLite::GetTypeName((MessageLite *)*ppvStack_60);
      pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,sVar5);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_a9,pLVar4);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_c0);
    }
    MessageLite::CheckTypeAndMergeFrom(src[local_6c],(MessageLite *)ppvStack_60[local_6c]);
    local_6c = local_6c + 1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_80);
}

Assistant:

int RepeatedPtrFieldBase::MergeIntoClearedMessages(
    const RepeatedPtrFieldBase& from) {
  Prefetch5LinesFrom1Line(&from);
  auto dst = reinterpret_cast<MessageLite**>(elements() + current_size_);
  auto src = reinterpret_cast<MessageLite* const*>(from.elements());
  int count = std::min(ClearedCount(), from.current_size_);
  for (int i = 0; i < count; ++i) {
    ABSL_DCHECK(src[i] != nullptr);
    ABSL_DCHECK(TypeId::Get(*src[i]) == TypeId::Get(*src[0]))
        << src[i]->GetTypeName() << " vs " << src[0]->GetTypeName();
    dst[i]->CheckTypeAndMergeFrom(*src[i]);
  }
  return count;
}